

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CExpressionList *expression)

{
  vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  *pvVar1;
  int i;
  ulong uVar2;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> children;
  ChildrenAnswers answers;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_d8;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_c0;
  ChildrenAnswers local_a8;
  string local_78;
  ChildrenAnswers local_58;
  
  local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (INode **)0x0;
  local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (INode **)0x0;
  uVar2 = 0;
  while( true ) {
    pvVar1 = CExpressionList::getExpressions(expression);
    if ((ulong)((long)(pvVar1->
                      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar1->
                      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar2) break;
    pvVar1 = CExpressionList::getExpressions(expression);
    local_a8.descriptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         *(pointer *)
          &(pvVar1->
           super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t;
    if (local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<IRT::INode_const*,std::allocator<IRT::INode_const*>>::
      _M_realloc_insert<IRT::INode_const*>
                ((vector<IRT::INode_const*,std::allocator<IRT::INode_const*>> *)&local_d8,
                 (iterator)
                 local_d8.
                 super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl
                 .super__Vector_impl_data._M_finish,(INode **)&local_a8);
    }
    else {
      *local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
       super__Vector_impl_data._M_finish =
           (INode *)local_a8.descriptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    uVar2 = uVar2 + 1;
  }
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector(&local_c0,&local_d8);
  VisitChildren(&local_a8,this,&local_c0);
  if (local_c0.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58.descriptions,&local_a8.descriptions);
  std::vector<int,_std::allocator<int>_>::vector(&local_58.ids,&local_a8.ids);
  AddChildrenAnswers(this,&local_58);
  if (local_58.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.descriptions);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ExpressionList","");
  AddLabel(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  if (local_a8.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.descriptions);
  if (local_d8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CExpressionList &expression ) {
    std::vector<const IRT::INode *> children;
    for ( int i = 0; i < expression.getExpressions( ).size( ); ++i ) {
        children.push_back( expression.getExpressions( )[ i ].get( ));
    }
    ChildrenAnswers answers = VisitChildren( children );

    AddChildrenAnswers( answers );
    AddLabel( "ExpressionList" );
    ++lastVisited;
}